

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<int&,char*&,char*&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args,char **args_1,
          char **args_2)

{
  format_args args_00;
  string_view fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  v9 *in_R8;
  int *in_R9;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  log_msg *in_stack_00000018;
  char **in_stack_00000020;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  buffer<char> *in_stack_fffffffffffffb68;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  logger *in_stack_fffffffffffffb78;
  logger *in_stack_fffffffffffffb80;
  unsigned_long_long in_stack_fffffffffffffba8;
  buffer<char> *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  size_t in_stack_fffffffffffffbc0;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> out;
  level_enum lvl_00;
  log_msg *in_stack_fffffffffffffbe0;
  string_view_t in_stack_fffffffffffffbe8;
  string_view_t in_stack_fffffffffffffbf8;
  source_loc in_stack_fffffffffffffc10;
  basic_string_view<char> local_388 [2];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_360;
  log_msg *local_358;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_2f0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char_*,_char_*>
  local_2e8;
  undefined8 local_2b8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char_*,_char_*>
  *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined1 local_271 [295];
  undefined1 local_14a;
  byte local_149;
  int *local_148;
  v9 *local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char_*,_char_*>
  *local_40;
  undefined8 *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char_*,_char_*>
  *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_int,_char_*,_char_*>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  
  lvl_00 = (level_enum)((ulong)in_RDI >> 0x20);
  local_148 = in_R9;
  local_140 = in_R8;
  local_128 = in_RDX;
  uStack_120 = in_RCX;
  local_149 = should_log(in_stack_fffffffffffffb78,
                         (level_enum)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  local_14a = details::backtracer::enabled((backtracer *)0x604beb);
  if (((local_149 & 1) != 0) || ((bool)local_14a)) {
    out.container = (buffer<char> *)local_271;
    std::allocator<char>::allocator();
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffb70,(allocator<char> *)in_stack_fffffffffffffb68);
    std::allocator<char>::~allocator((allocator<char> *)local_271);
    ::fmt::v9::appender::back_insert_iterator
              ((appender *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    local_2a8 = local_128;
    uStack_2a0 = uStack_120;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,int&,char*&,char*&>
              (&local_2e8,local_140,local_148,in_stack_00000020,(char **)in_R8);
    local_38 = &local_2b8;
    local_40 = &local_2e8;
    local_20 = 0xcc1;
    local_2b8 = 0xcc1;
    fmt_00.data_._4_4_ = in_stack_fffffffffffffbbc;
    fmt_00.data_._0_4_ = in_stack_fffffffffffffbb8;
    fmt_00.size_ = in_stack_fffffffffffffbc0;
    args_00.field_1.values_ = in_stack_fffffffffffffbb0.values_;
    args_00.desc_ = in_stack_fffffffffffffba8;
    local_30 = local_40;
    local_28 = local_40;
    local_18 = local_38;
    local_2b0 = local_40;
    local_2f0.container =
         (buffer<char> *)::fmt::v9::vformat_to<fmt::v9::appender,_0>(out.container,fmt_00,args_00);
    local_358 = in_stack_00000018;
    pbStack_360 = in_stack_00000010;
    ::fmt::v9::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffb70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
    this_00 = (buffer<char> *)(local_271 + 1);
    s = ::fmt::v9::detail::buffer<char>::data(this_00);
    count = ::fmt::v9::detail::buffer<char>::size(this_00);
    ::fmt::v9::basic_string_view<char>::basic_string_view(local_388,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffc10,in_stack_fffffffffffffbf8,lvl_00,
               in_stack_fffffffffffffbe8);
    log_it_(in_stack_fffffffffffffb80,local_358,SUB81((ulong)pbStack_360 >> 0x38,0),
            SUB81((ulong)pbStack_360 >> 0x30,0));
    ::fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (pbStack_360);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }